

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  _Rb_tree_node_base *p_Var1;
  SourceLineInfo *_lineInfo;
  size_t *psVar2;
  TestCase *_name;
  IStreamingReporter *pIVar3;
  size_t sVar4;
  pointer pUVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool _missingAssertions;
  uint uVar9;
  streambuf *psVar10;
  _Rb_tree_node_base *p_Var11;
  pointer pUVar12;
  RunState RVar13;
  undefined1 auVar14 [16];
  Guard guard;
  SectionInfo testCaseSection;
  StreamRedirect cerrRedir;
  SectionStats testCaseSectionStats;
  string local_508;
  size_t local_4e8;
  size_t sStack_4e0;
  SectionInfo local_4d0;
  undefined1 local_468 [408];
  undefined1 local_2d0 [48];
  char local_2a0 [24];
  _Alloc_hider local_288;
  char local_278 [16];
  Flags local_268;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_4d0,_lineInfo,(string *)_name,&(_name->super_TestCaseInfo).description);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar3,&local_4d0);
  local_4e8 = (this->m_totals).assertions.passed;
  sStack_4e0 = (this->m_totals).assertions.failed;
  sVar4 = (this->m_totals).assertions.failedButOk;
  local_468._0_8_ = local_468 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"TEST_CASE","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_2d0,(string *)local_468,_lineInfo,&local_508,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_2d0);
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).lineInfo,(string *)(local_2d0 + 0x20));
  (this->m_lastAssertionInfo).lineInfo.line = local_2a0._16_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_288);
  (this->m_lastAssertionInfo).resultDisposition = local_268;
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if ((char *)local_2d0._32_8_ != local_2a0) {
    operator_delete((void *)local_2d0._32_8_);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_);
  }
  local_508._M_dataplus._M_p = (pointer)(this->m_testCaseTracker).nullableValue;
  ((TestCaseTracker *)local_508._M_dataplus._M_p)->m_currentSection =
       (TrackedSection *)local_508._M_dataplus._M_p;
  ((TestCaseTracker *)local_508._M_dataplus._M_p)->m_completedASectionThisRun = false;
  if ((((TestCaseTracker *)local_508._M_dataplus._M_p)->m_testCase).m_runState == NotStarted) {
    (((TestCaseTracker *)local_508._M_dataplus._M_p)->m_testCase).m_runState = Executing;
  }
  gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
  uVar8 = local_2d0._8_8_;
  uVar7 = local_2d0._0_8_;
  uVar9 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar9 & 1) == 0) {
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_2d0,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect((StreamRedirect *)local_468,(ostream *)&std::cerr,redirectedCerr)
    ;
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_468);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_2d0);
  }
  gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
  _Var6._M_p = local_508._M_dataplus._M_p;
  psVar10 = (streambuf *)(local_2d0._8_8_ + ((local_2d0._0_8_ - uVar7) * 1000000 - uVar8));
  auVar14._8_4_ = (int)((ulong)psVar10 >> 0x20);
  auVar14._0_8_ = psVar10;
  auVar14._12_4_ = 0x45300000;
  p_Var11 = *(_Rb_tree_node_base **)(local_508._M_dataplus._M_p + 0x40);
  p_Var1 = (_Rb_tree_node_base *)(local_508._M_dataplus._M_p + 0x30);
  RVar13 = Completed;
  do {
    if (p_Var11 == p_Var1) {
LAB_00142206:
      *(RunState *)(_Var6._M_p + 0x20) = RVar13;
      pUVar5 = (this->m_unfinishedSections).
               super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar12 = (this->m_unfinishedSections).
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while (pUVar12 != pUVar5) {
        (*(this->super_IResultCapture)._vptr_IResultCapture[4])
                  (pUVar12[-1].durationInSeconds,this,pUVar12 + -1,&pUVar12[-1].prevAssertions);
        pUVar12 = pUVar12 + -1;
      }
      std::
      vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
      ::_M_erase_at_end(&this->m_unfinishedSections,
                        (this->m_unfinishedSections).
                        super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
                (&this->m_messages,
                 (this->m_messages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start);
      local_468._0_8_ = (this->m_totals).assertions.passed - local_4e8;
      local_468._8_8_ = (this->m_totals).assertions.failed - sStack_4e0;
      local_468._16_8_ = (this->m_totals).assertions.failedButOk - sVar4;
      _missingAssertions = testForMissingAssertions(this,(Counts *)local_468);
      uVar8 = local_468._16_8_;
      uVar7 = local_468._8_8_;
      if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
        local_468._16_8_ = local_468._8_8_;
        local_468._8_8_ = uVar8;
        psVar2 = &(this->m_totals).assertions.failed;
        *psVar2 = *psVar2 - uVar7;
        psVar2 = &(this->m_totals).assertions.failedButOk;
        *psVar2 = (size_t)(uVar7 + *psVar2);
      }
      SectionStats::SectionStats
                ((SectionStats *)local_2d0,&local_4d0,(Counts *)local_468,
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)psVar10) - 4503599627370496.0)) / 1000000.0,
                 _missingAssertions);
      pIVar3 = (this->m_reporter).m_p;
      (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,local_2d0);
      SectionStats::~SectionStats((SectionStats *)local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.lineInfo.file._M_dataplus._M_p != &local_4d0.lineInfo.file.field_2) {
        operator_delete(local_4d0.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.description._M_dataplus._M_p != &local_4d0.description.field_2) {
        operator_delete(local_4d0.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.name._M_dataplus._M_p != &local_4d0.name.field_2) {
        operator_delete(local_4d0.name._M_dataplus._M_p);
      }
      return;
    }
    if (p_Var11[3]._M_color != 3) {
      RVar13 = ExecutingChildren;
      goto LAB_00142206;
    }
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
  } while( true );
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_activeTestCase->invoke();
                }
                else {
                    m_activeTestCase->invoke();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ResultBuilder exResult( m_lastAssertionInfo.macroName.c_str(),
                                        m_lastAssertionInfo.lineInfo,
                                        m_lastAssertionInfo.capturedExpression.c_str(),
                                        m_lastAssertionInfo.resultDisposition );
                exResult.useActiveException();
            }
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }